

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O1

void visit_loop_stmt(gvisitor_t *self,gnode_loop_stmt_t *node)

{
  long *plVar1;
  gtoken_t gVar2;
  ulong *puVar3;
  void *pvVar4;
  long lVar5;
  symboltable_t *table;
  char *format;
  ulong uVar6;
  long lVar7;
  gnode_t *pgVar8;
  char *pcVar9;
  gnode_variable_decl_t *var;
  gnode_binary_expr_t *expr;
  gnode_loop_stmt_t *node_00;
  
  gVar2 = (node->base).token.type;
  pvVar4 = self->data;
  lVar5 = *(long *)((long)pvVar4 + 0x10);
  if (*(long *)((long)pvVar4 + 8) == lVar5) {
    lVar7 = 8;
    if (lVar5 != 0) {
      lVar7 = lVar5 * 2;
    }
    *(long *)((long)pvVar4 + 0x10) = lVar7;
    pvVar4 = realloc(*(void **)((long)pvVar4 + 0x18),lVar7 * 2);
    *(void **)((long)self->data + 0x18) = pvVar4;
  }
  pvVar4 = self->data;
  lVar5 = *(long *)((long)pvVar4 + 8);
  *(long *)((long)pvVar4 + 8) = lVar5 + 1;
  *(short *)(*(long *)((long)pvVar4 + 0x18) + lVar5 * 2) = (short)gVar2;
  lVar5 = 0x48;
  if (gVar2 == TOK_KEY_WHILE) {
    pcVar9 = "WHILE";
LAB_0011e530:
    node_00 = *(gnode_loop_stmt_t **)((long)&(node->base).tag + lVar5);
  }
  else {
    if (gVar2 == TOK_KEY_REPEAT) {
      pcVar9 = "REPEAT";
      lVar5 = 0x58;
      goto LAB_0011e530;
    }
    if (gVar2 == TOK_KEY_FOR) {
      pcVar9 = "FOR";
      goto LAB_0011e530;
    }
    node_00 = (gnode_loop_stmt_t *)0x0;
    pcVar9 = (char *)0x0;
  }
  if (gVar2 == TOK_KEY_WHILE) {
    if (node->cond == (gnode_t *)0x0) {
LAB_0011e6a5:
      format = "Missing %s condition.";
      goto LAB_0011e6b7;
    }
LAB_0011e544:
    if (node->stmt != (gnode_t *)0x0) {
LAB_0011e574:
      if (((node_00 == (gnode_loop_stmt_t *)0x0) || ((node_00->base).tag != NODE_BINARY_EXPR)) ||
         (*(int *)&node_00->cond != 0x45)) {
        if (gVar2 == TOK_KEY_FOR) {
          pgVar8 = node->cond;
          if ((pgVar8 == (gnode_t *)0x0) ||
             ((pgVar8->tag != NODE_VARIABLE_DECL &&
              ((pgVar8 == (gnode_t *)0x0 || (pgVar8->tag != NODE_IDENTIFIER_EXPR)))))) {
            report_error(self,GRAVITY_ERROR_SEMANTIC,&node_00->base,
                         "FOR declaration must be a variable declaration or a local identifier.",
                         pcVar9);
          }
          pgVar8 = node->cond;
          if ((pgVar8 != (gnode_t *)0x0) && (pgVar8->tag == NODE_VARIABLE_DECL)) {
            if ((*(ulong **)&pgVar8[1].token != (ulong *)0x0) && (1 < **(ulong **)&pgVar8[1].token))
            {
              report_error(self,GRAVITY_ERROR_SEMANTIC,&node_00->base,
                           "Cannot declare more than one variable inside a FOR loop.");
            }
            if (*(long *)(**(long **)(*(long *)&pgVar8[1].token + 0x10) + 0x60) != 0) {
              report_error(self,GRAVITY_ERROR_SEMANTIC,&node_00->base,
                           "Assignment expression prohibited in a FOR loop.");
            }
          }
        }
        if (gVar2 == TOK_KEY_WHILE) {
          gvisit(self,node->cond);
          pgVar8 = node->stmt;
        }
        else {
          if (gVar2 != TOK_KEY_REPEAT) {
            if (gVar2 == TOK_KEY_FOR) {
              puVar3 = *self->data;
              if (puVar3 == (ulong *)0x0) {
                uVar6 = 0xffffffffffffffff;
              }
              else {
                uVar6 = *puVar3 - 1;
              }
              if (uVar6 < *puVar3) {
                pgVar8 = *(gnode_t **)((puVar3[2] - 8) + *puVar3 * 8);
              }
              else {
                pgVar8 = (gnode_t *)0x0;
              }
              table = symtable_from_node(pgVar8);
              symboltable_enter_scope(table);
              gvisit(self,node->cond);
              pgVar8 = node->cond;
              if (((pgVar8 != (gnode_t *)0x0) && (pgVar8->tag == NODE_IDENTIFIER_EXPR)) &&
                 (pgVar8[1].token.colno != 0)) {
                report_error(self,GRAVITY_ERROR_SEMANTIC,&node_00->base,
                             "FOR declaration must be a variable declaration or a local identifier."
                            );
              }
              gvisit(self,node->expr);
              gvisit(self,node->stmt);
              symboltable_exit_scope(table,&node->nclose);
            }
            goto LAB_0011e679;
          }
          gvisit(self,node->stmt);
          pgVar8 = node->expr;
        }
        gvisit(self,pgVar8);
LAB_0011e679:
        plVar1 = (long *)((long)self->data + 8);
        *plVar1 = *plVar1 + -1;
        return;
      }
      format = 
      "Assignments in Gravity does not return a value so cannot be used inside a %s condition.";
      node = node_00;
      goto LAB_0011e6b7;
    }
  }
  else {
    if (gVar2 == TOK_KEY_FOR) {
      if (node->cond == (gnode_t *)0x0) goto LAB_0011e6a5;
      if (node->expr == (gnode_t *)0x0) {
LAB_0011e69c:
        format = "Missing %s expression.";
        goto LAB_0011e6b7;
      }
      goto LAB_0011e544;
    }
    if (gVar2 != TOK_KEY_REPEAT) goto LAB_0011e574;
    if (node->stmt != (gnode_t *)0x0) {
      if (node->expr == (gnode_t *)0x0) goto LAB_0011e69c;
      goto LAB_0011e574;
    }
  }
  format = "Missing %s statement.";
LAB_0011e6b7:
  report_error(self,GRAVITY_ERROR_SEMANTIC,&node->base,format,pcVar9);
  return;
}

Assistant:

static void visit_loop_stmt (gvisitor_t *self, gnode_loop_stmt_t *node) {
    DEBUG_CODEGEN("visit_loop_stmt");

    gtoken_t type = NODE_TOKEN_TYPE(node);
    assert((type == TOK_KEY_WHILE) || (type == TOK_KEY_REPEAT) || (type == TOK_KEY_FOR));

    if (type == TOK_KEY_WHILE) {
        visit_loop_while_stmt(self, node);
    } else if (type == TOK_KEY_REPEAT) {
        visit_loop_repeat_stmt(self, node);
    } else if (type == TOK_KEY_FOR) {
        visit_loop_for_stmt(self, node);
    }
}